

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::collectremovepoints(tetgenmesh *this,arraypool *remptlist)

{
  long lVar1;
  uint *puVar2;
  byte bVar3;
  uint uVar4;
  memorypool *pmVar5;
  void **ppvVar6;
  double *pdVar7;
  ulong uVar8;
  tetgenbehavior *ptVar9;
  undefined8 uVar10;
  char **ppcVar11;
  int iVar12;
  point searchpt;
  char *pcVar13;
  void *pvVar14;
  tetgenio *ptVar15;
  arraypool *paVar16;
  char *pcVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  
  if (this->b->metric != 0) {
    pmVar5 = this->points;
    ppvVar6 = pmVar5->firstblock;
    pmVar5->pathblock = ppvVar6;
    pmVar5->pathitem =
         (void *)((long)ppvVar6 +
                 (((long)pmVar5->alignbytes + 8U) -
                 (ulong)(ppvVar6 + 1) % (ulong)(long)pmVar5->alignbytes));
    pmVar5->pathitemsleft = pmVar5->itemsperblock;
    while (searchpt = (point)memorypool::traverse(this->points), searchpt != (point)0x0) {
      if ((*(uint *)((long)searchpt + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) != 0xa00) {
        do {
          if (0.0 < searchpt[this->pointmtrindex]) {
            getvertexstar(this,1,searchpt,this->cavetetlist,this->cavetetvertlist,(arraypool *)0x0);
            paVar16 = this->cavetetvertlist;
            pdVar7 = *(double **)*paVar16->toparray;
            dVar26 = *pdVar7 - *searchpt;
            dVar25 = pdVar7[1] - searchpt[1];
            dVar27 = pdVar7[2] - searchpt[2];
            dVar25 = SQRT(dVar27 * dVar27 + dVar26 * dVar26 + dVar25 * dVar25);
            if (1 < paVar16->objects) {
              lVar20 = 1;
              do {
                pdVar7 = *(double **)
                          (paVar16->toparray
                           [(uint)lVar20 >> ((byte)paVar16->log2objectsperblock & 0x1f)] +
                          (long)(int)((uint)lVar20 & paVar16->objectsperblockmark) *
                          (long)paVar16->objectbytes);
                dVar26 = *pdVar7 - *searchpt;
                dVar27 = pdVar7[1] - searchpt[1];
                dVar28 = pdVar7[2] - searchpt[2];
                dVar26 = SQRT(dVar28 * dVar28 + dVar26 * dVar26 + dVar27 * dVar27);
                if (dVar25 <= dVar26) {
                  dVar26 = dVar25;
                }
                dVar25 = dVar26;
                lVar20 = lVar20 + 1;
              } while (paVar16->objects != lVar20);
            }
            paVar16->objects = 0;
            this->cavetetlist->objects = 0;
            if (dVar25 < searchpt[this->pointmtrindex]) {
              puVar2 = (uint *)((long)searchpt + (long)this->pointmarkindex * 4 + 4);
              *puVar2 = *puVar2 | 1;
              pcVar13 = arraypool::getblock(remptlist,(int)remptlist->objects);
              uVar8 = remptlist->objects;
              remptlist->objects = uVar8 + 1;
              *(point *)(pcVar13 +
                        (long)remptlist->objectbytes *
                        ((long)remptlist->objectsperblock - 1U & uVar8)) = searchpt;
            }
          }
          do {
            searchpt = (point)memorypool::traverse(this->points);
            if (searchpt == (point)0x0) goto LAB_0014234e;
          } while ((*(uint *)((long)searchpt + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) ==
                   0xa00);
        } while( true );
      }
    }
LAB_0014234e:
    if (1 < this->b->verbose) {
      printf("    Coarsen %ld oversized points.\n");
    }
  }
  if (this->in->pointmarkerlist != (int *)0x0) {
    pmVar5 = this->points;
    ppvVar6 = pmVar5->firstblock;
    pmVar5->pathblock = ppvVar6;
    pmVar5->pathitem =
         (void *)((long)ppvVar6 +
                 (((long)pmVar5->alignbytes + 8U) -
                 (ulong)(ppvVar6 + 1) % (ulong)(long)pmVar5->alignbytes));
    pmVar5->pathitemsleft = pmVar5->itemsperblock;
    do {
      pvVar14 = memorypool::traverse(this->points);
      if (pvVar14 == (void *)0x0) goto LAB_00142468;
    } while ((*(uint *)((long)pvVar14 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00);
    ptVar15 = this->in;
    if (0 < ptVar15->numberofpoints) {
      lVar20 = 0;
      do {
        if (ptVar15->pointmarkerlist[lVar20] == -1) {
          puVar2 = (uint *)((long)pvVar14 + (long)this->pointmarkindex * 4 + 4);
          *puVar2 = *puVar2 | 1;
          pcVar13 = arraypool::getblock(remptlist,(int)remptlist->objects);
          uVar8 = remptlist->objects;
          remptlist->objects = uVar8 + 1;
          *(void **)(pcVar13 +
                    (long)remptlist->objectbytes * ((long)remptlist->objectsperblock - 1U & uVar8))
               = pvVar14;
        }
        lVar20 = lVar20 + 1;
        do {
          pvVar14 = memorypool::traverse(this->points);
          if (pvVar14 == (void *)0x0) goto LAB_00142468;
        } while ((*(uint *)((long)pvVar14 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) ==
                 0xa00);
        ptVar15 = this->in;
      } while (lVar20 < ptVar15->numberofpoints);
    }
LAB_00142468:
    if (1 < this->b->verbose) {
      printf("    Coarsen %ld marked points.\n");
    }
  }
  ptVar9 = this->b;
  if (0 < ptVar9->coarsen_param) {
    if (1 < ptVar9->verbose) {
      printf("    Coarsen %g percent of interior points.\n",ptVar9->coarsen_percent * 100.0);
    }
    paVar16 = (arraypool *)operator_new(0x30);
    paVar16->objectbytes = 8;
    paVar16->objectsperblock = 0x400;
    paVar16->log2objectsperblock = 10;
    paVar16->objectsperblockmark = 0x3ff;
    paVar16->toparraylen = 0;
    paVar16->toparray = (char **)0x0;
    paVar16->objects = 0;
    paVar16->totalmemory = 0;
    pmVar5 = this->points;
    ppvVar6 = pmVar5->firstblock;
    pmVar5->pathblock = ppvVar6;
    pmVar5->pathitem =
         (void *)((long)ppvVar6 +
                 (((long)pmVar5->alignbytes + 8U) -
                 (ulong)(ppvVar6 + 1) % (ulong)(long)pmVar5->alignbytes));
    pmVar5->pathitemsleft = pmVar5->itemsperblock;
    while (pvVar14 = memorypool::traverse(this->points), pvVar14 != (void *)0x0) {
      if ((*(uint *)((long)pvVar14 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) != 0xa00) {
        lVar20 = 8;
        lVar22 = 0;
        do {
          if ((*(int *)((long)pvVar14 + (long)this->pointmarkindex * 4 + 4) >> 8) - 5U < 4) {
            pcVar13 = arraypool::getblock(paVar16,(int)lVar22);
            uVar8 = paVar16->objects;
            lVar20 = (long)paVar16->objectbytes;
            lVar22 = uVar8 + 1;
            paVar16->objects = lVar22;
            *(void **)(pcVar13 + ((long)paVar16->objectsperblock - 1U & uVar8) * lVar20) = pvVar14;
          }
          do {
            pvVar14 = memorypool::traverse(this->points);
            if (pvVar14 == (void *)0x0) {
              if (0 < lVar22) {
                srand((uint)lVar22);
                lVar24 = 0;
                do {
                  iVar12 = rand();
                  lVar1 = lVar24 + 1;
                  uVar18 = iVar12 % (int)lVar1;
                  bVar3 = (byte)paVar16->log2objectsperblock;
                  pcVar13 = paVar16->toparray[(uint)lVar24 >> (bVar3 & 0x1f)];
                  iVar12 = (int)lVar20;
                  iVar23 = ((uint)lVar24 & paVar16->objectsperblockmark) * iVar12;
                  pcVar17 = paVar16->toparray[(int)uVar18 >> (bVar3 & 0x1f)];
                  iVar19 = (paVar16->objectsperblockmark & uVar18) * iVar12;
                  uVar10 = *(undefined8 *)(pcVar13 + iVar23);
                  *(undefined8 *)(pcVar13 + iVar23) = *(undefined8 *)(pcVar17 + iVar19);
                  *(undefined8 *)(pcVar17 + iVar19) = uVar10;
                  lVar24 = lVar1;
                } while (lVar1 < lVar22);
                uVar18 = (uint)((double)lVar22 * this->b->coarsen_percent);
                if (0 < (int)uVar18) {
                  ppcVar11 = paVar16->toparray;
                  iVar19 = paVar16->log2objectsperblock;
                  uVar4 = paVar16->objectsperblockmark;
                  uVar21 = 0;
                  do {
                    pcVar13 = ppcVar11[uVar21 >> ((byte)iVar19 & 0x1f)];
                    iVar23 = (uVar4 & uVar21) * iVar12;
                    if ((*(byte *)(*(long *)(pcVar13 + iVar23) + 4 + (long)this->pointmarkindex * 4)
                        & 1) == 0) {
                      pcVar17 = arraypool::getblock(remptlist,(int)remptlist->objects);
                      uVar8 = remptlist->objects;
                      remptlist->objects = uVar8 + 1;
                      *(undefined8 *)
                       (pcVar17 +
                       (long)remptlist->objectbytes *
                       ((long)remptlist->objectsperblock - 1U & uVar8)) =
                           *(undefined8 *)(pcVar13 + iVar23);
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar18 != uVar21);
                }
              }
              goto LAB_001426f2;
            }
          } while ((*(uint *)((long)pvVar14 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) ==
                   0xa00);
        } while( true );
      }
    }
LAB_001426f2:
    arraypool::~arraypool(paVar16);
    operator_delete(paVar16,0x30);
  }
  lVar20 = remptlist->objects;
  if (0 < lVar20) {
    ppcVar11 = remptlist->toparray;
    lVar22 = 0;
    do {
      puVar2 = (uint *)(*(long *)(ppcVar11[(uint)lVar22 >>
                                           ((byte)remptlist->log2objectsperblock & 0x1f)] +
                                 (long)remptlist->objectbytes *
                                 (long)(int)(remptlist->objectsperblockmark & (uint)lVar22)) + 4 +
                       (long)this->pointmarkindex * 4);
      *puVar2 = *puVar2 & 0xfffffffe;
      lVar22 = lVar22 + 1;
    } while (lVar20 != lVar22);
  }
  return;
}

Assistant:

void tetgenmesh::collectremovepoints(arraypool *remptlist)
{
  point ptloop, *parypt;
  verttype vt;

  // If a mesh sizing function is given. Collect vertices whose mesh size
  //   is greater than its smallest edge length.
  if (b->metric) { // -m option
    REAL len, smlen;
    int i;
    points->traversalinit();
    ptloop = pointtraverse();
    while (ptloop != NULL) {
      if (ptloop[pointmtrindex] > 0) {
        // Get the smallest edge length at this vertex.
        getvertexstar(1, ptloop, cavetetlist, cavetetvertlist, NULL);
        parypt = (point *) fastlookup(cavetetvertlist, 0);
        smlen = distance(ptloop, *parypt);
        for (i = 1; i < cavetetvertlist->objects; i++) {
          parypt = (point *) fastlookup(cavetetvertlist, i);
          len = distance(ptloop, *parypt);
          if (len < smlen) {
            smlen = len;
          }
        }
        cavetetvertlist->restart();
        cavetetlist->restart();
        if (smlen < ptloop[pointmtrindex]) {
          pinfect(ptloop);
          remptlist->newindex((void **) &parypt);
          *parypt = ptloop;
        }
      }
      ptloop = pointtraverse();
    }
    if (b->verbose > 1) {
      printf("    Coarsen %ld oversized points.\n", remptlist->objects); 
    }
  }

  // If 'in->pointmarkerlist' exists, Collect vertices with markers '-1'.
  if (in->pointmarkerlist != NULL) {
    long bak_count = remptlist->objects;
    points->traversalinit();
    ptloop = pointtraverse();
    int index = 0;
    while (ptloop != NULL) {
      if (index < in->numberofpoints) {
        if (in->pointmarkerlist[index] == -1) {
          pinfect(ptloop);
          remptlist->newindex((void **) &parypt);
          *parypt = ptloop;
        }
      } else {
        // Remaining are not input points. Stop here.
        break; 
      }
      index++;
      ptloop = pointtraverse();
    }
    if (b->verbose > 1) {
      printf("    Coarsen %ld marked points.\n", remptlist->objects - bak_count); 
    }
  } // if (in->pointmarkerlist != NULL)

  if (b->coarsen_param > 0) { // -R1/#
    // Remove a coarsen_percent number of interior points.
    if (b->verbose > 1) {
      printf("    Coarsen %g percent of interior points.\n", 
             b->coarsen_percent * 100.0);
    }
    arraypool *intptlist = new arraypool(sizeof(point *), 10);
    // Count the total number of interior points.
    points->traversalinit();
    ptloop = pointtraverse();
    while (ptloop != NULL) {
      vt = pointtype(ptloop);
      if ((vt == VOLVERTEX) || (vt == FREEVOLVERTEX) || 
          (vt == FREEFACETVERTEX) || (vt == FREESEGVERTEX)) {
        intptlist->newindex((void **) &parypt);
        *parypt = ptloop;
      }
      ptloop = pointtraverse();
    }
    if (intptlist->objects > 0l) {
      // Sort the list of points randomly.
      point *parypt_i, swappt;
      int randindex, i;
      srand(intptlist->objects);
      for (i = 0; i < intptlist->objects; i++) {
        randindex = rand() % (i + 1); // randomnation(i + 1);
        parypt_i = (point *) fastlookup(intptlist, i); 
        parypt = (point *) fastlookup(intptlist, randindex);
        // Swap this two points.
        swappt = *parypt_i;
        *parypt_i = *parypt;
        *parypt = swappt;
      }
      int remcount = (int) ((REAL) intptlist->objects * b->coarsen_percent);
      // Return the first remcount points.
      for (i = 0; i < remcount; i++) {
        parypt_i = (point *) fastlookup(intptlist, i);
        if (!pinfected(*parypt_i)) {
          pinfected(*parypt_i);
          remptlist->newindex((void **) &parypt);
          *parypt = *parypt_i;
        }
      }
    }
    delete intptlist;
  }

  // Unmark all collected vertices.
  for (int i = 0; i < remptlist->objects; i++) {
    parypt = (point *) fastlookup(remptlist, i);
    puninfect(*parypt);
  }
}